

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_google_units.cpp
# Opt level: O2

void __thiscall googleUnits_unitTypes_Test::TestBody(googleUnits_unitTypes_Test *this)

{
  char cVar1;
  bool bVar2;
  istream *piVar3;
  char *in_R9;
  precise_unit pVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2e0;
  AssertionResult gtest_ar_;
  AssertHelper local_2c0;
  string local_2b8;
  string tp;
  string local_278;
  string utype;
  ifstream tfile;
  
  std::ifstream::ifstream
            (&tfile,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/google_defined_units.txt"
             ,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    tp._M_dataplus._M_p = (pointer)&tp.field_2;
    tp._M_string_length = 0;
    tp.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&tfile,(string *)&tp);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::string::find((char)&tp,0x3a);
      std::__cxx11::string::substr((ulong)&utype,(ulong)&tp);
      bVar2 = std::operator==(&utype,"Misc");
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_278,(string *)&utype);
        pVar4 = units::default_unit(&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        bVar2 = pVar4.base_units_ != (unit_data)0xfa94a488;
        gtest_ar_.success_ = bVar2 || !NAN(pVar4.multiplier_);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!bVar2 && NAN(pVar4.multiplier_)) {
          testing::Message::Message((Message *)&local_2e0);
          std::operator<<((ostream *)(local_2e0._M_head_impl + 0x10),(string *)&utype);
          std::operator<<((ostream *)(local_2e0._M_head_impl + 0x10),
                          " does not produce a valid default unit");
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_2b8,(internal *)&gtest_ar_,(AssertionResult *)"is_valid(bunit)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_2c0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_google_units.cpp"
                     ,0x1f,local_2b8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_2c0,(Message *)&local_2e0);
          testing::internal::AssertHelper::~AssertHelper(&local_2c0);
          std::__cxx11::string::~string((string *)&local_2b8);
          if (local_2e0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_2e0._M_head_impl + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
      }
      std::__cxx11::string::~string((string *)&utype);
    }
    std::__cxx11::string::~string((string *)&tp);
  }
  std::ifstream::~ifstream(&tfile);
  return;
}

Assistant:

TEST(googleUnits, unitTypes)
{
    std::ifstream tfile(TEST_FILE_FOLDER "/google_defined_units.txt");
    if (tfile.is_open()) {  // checking whether the file is open
        std::string tp;
        while (std::getline(tfile, tp)) {  // read data from file object and put
                                           // it into string.
            auto cloc = tp.find_first_of(':');
            std::string utype = tp.substr(0, cloc);
            if (utype == "Misc") {
                continue;
            }
            auto bunit = units::default_unit(utype);
            EXPECT_TRUE(is_valid(bunit))
                << utype << " does not produce a valid default unit";
        }
    }
}